

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_tcu::Vector<float,_3>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_tcu::Vector<float,_3>_>_>
         *this)

{
  double *pdVar1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  ostringstream *poVar4;
  float fVar5;
  Precision PVar6;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  Statement *pSVar7;
  ShaderExecutor *pSVar8;
  Variable<tcu::Vector<float,_3>_> *pVVar9;
  pointer pcVar10;
  Variable<float> *pVVar11;
  TestLog *pTVar12;
  pointer pVVar13;
  bool bVar14;
  bool bVar15;
  int iVar16;
  uint uVar17;
  undefined8 uVar18;
  long lVar19;
  long lVar20;
  IVal *pIVar21;
  IVal *x;
  undefined8 *puVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  size_t sVar24;
  string *psVar25;
  IVal IVar26;
  FloatFormat *pFVar27;
  TestStatus *pTVar28;
  byte bVar29;
  double dVar30;
  double dVar31;
  IVal in1;
  FuncSet funcs;
  IVal in2;
  IVal in3;
  Outputs<vkt::shaderexecutor::OutTypes<float,_tcu::Vector<float,_3>_>_> outputs;
  IVal in0;
  Environment env;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  FloatFormat highpFmt;
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffffa88;
  undefined1 local_570 [12];
  undefined4 uStack_564;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_560;
  undefined1 local_550 [12];
  uint uStack_544;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_540;
  _Rb_tree_node_base *local_530;
  double local_528;
  TestLog *local_508;
  string local_500;
  size_t local_4e0;
  ulong local_4d8;
  FloatFormat *local_4d0;
  TestLog *local_4c8;
  double dStack_4c0;
  _Base_ptr p_Stack_4b8;
  TestStatus *local_4a8;
  long local_4a0;
  Outputs<vkt::shaderexecutor::OutTypes<float,_tcu::Vector<float,_3>_>_> local_498;
  undefined1 local_468 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  double local_448;
  Precision local_440;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_438;
  undefined4 local_430;
  ios_base local_3f8 [8];
  ios_base local_3f0 [264];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2e8;
  pointer local_2b8;
  pointer local_2b0;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_2a8;
  pointer local_248;
  pointer local_240;
  pointer local_238;
  pointer local_230;
  FloatFormat local_228;
  ResultCollector local_1f8;
  IVal local_1a8;
  ios_base local_138 [264];
  
  bVar29 = 0;
  this_00 = this->m_samplings;
  pFVar27 = &(this->m_caseCtx).floatFormat;
  PVar6 = (this->m_caseCtx).precision;
  sVar24 = (this->m_caseCtx).numRandoms;
  local_4a8 = __return_storage_ptr__;
  iVar16 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_4d0 = pFVar27;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_2a8,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar27,(FloatFormat *)(ulong)PVar6,(Precision)sVar24,(ulong)(iVar16 + 0xdeadbeef),
             in_stack_fffffffffffffa88);
  pVVar13 = local_2a8.in0.
            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  sVar24 = ((long)local_2a8.in0.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_2a8.in0.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  Outputs<vkt::shaderexecutor::OutTypes<float,_tcu::Vector<float,_3>_>_>::Outputs(&local_498,sVar24)
  ;
  local_228.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_228.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_228.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_228.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_228.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_228.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_228.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_228.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_228._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2e8._M_impl.super__Rb_tree_header._M_header;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2e8._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_508 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_248 = local_2a8.in0.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_240 = local_2a8.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_238 = local_2a8.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_230 = local_2a8.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2b8 = local_498.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_2b0 = local_498.out1.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  poVar4 = (ostringstream *)(local_468 + 8);
  local_468._0_8_ = local_508;
  std::__cxx11::ostringstream::ostringstream(poVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar4);
  std::ios_base::~ios_base(local_3f0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  p_Var3 = (_Rb_tree_node_base *)(local_550 + 8);
  stack0xfffffffffffffab8 = (double)((ulong)uStack_544 << 0x20);
  aStack_540._M_allocated_capacity = 0;
  local_528 = 0.0;
  pSVar7 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  aStack_540._8_8_ = p_Var3;
  local_530 = p_Var3;
  local_4e0 = sVar24;
  (*pSVar7->_vptr_Statement[4])(pSVar7,local_550);
  if ((_Rb_tree_node_base *)aStack_540._8_8_ != p_Var3) {
    uVar18 = aStack_540._8_8_;
    do {
      (**(code **)(**(long **)(uVar18 + 0x20) + 0x30))(*(long **)(uVar18 + 0x20),&local_1a8);
      uVar18 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar18);
    } while ((_Rb_tree_node_base *)uVar18 != p_Var3);
  }
  sVar24 = local_4e0;
  if (local_528 != 0.0) {
    poVar4 = (ostringstream *)(local_468 + 8);
    local_468._0_8_ = local_508;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,(char *)local_570._0_8_,CONCAT44(uStack_564,local_570._8_4_));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570._0_8_ != &local_560) {
      operator_delete((void *)local_570._0_8_,local_560._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_3f0);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_550);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  pSVar8 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar8->_vptr_ShaderExecutor[2])(pSVar8,sVar24 & 0xffffffff,&local_248,&local_2b8,0);
  lVar19 = 8;
  do {
    local_468[lVar19 + -8] = 0;
    *(undefined8 *)(local_468 + lVar19) = 0x7ff0000000000000;
    *(undefined8 *)(local_468 + lVar19 + 8) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x50);
  lVar19 = 8;
  do {
    local_468[lVar19 + -8] = 0;
    *(undefined8 *)(local_468 + lVar19) = 0x7ff0000000000000;
    *(undefined8 *)(local_468 + lVar19 + 8) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x50);
  local_550._0_8_ = local_550._0_8_ & 0xffffffffffffff00;
  stack0xfffffffffffffab8 = INFINITY;
  aStack_540._M_allocated_capacity = 0xfff0000000000000;
  lVar19 = 8;
  do {
    *(undefined1 *)((long)local_1a8.m_data + lVar19 + -8) = 0;
    *(undefined8 *)(&local_1a8.m_data[0].m_hasNaN + lVar19) = 0x7ff0000000000000;
    *(undefined8 *)((long)&local_1a8.m_data[0].m_lo + lVar19) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x50);
  lVar19 = 8;
  do {
    *(undefined1 *)((long)local_1a8.m_data + lVar19 + -8) = 0;
    *(undefined8 *)(&local_1a8.m_data[0].m_hasNaN + lVar19) = 0x7ff0000000000000;
    *(undefined8 *)((long)&local_1a8.m_data[0].m_lo + lVar19) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x50);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_2e8,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.m_ptr,
             (IVal *)local_468);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_2e8,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_570);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_2e8,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_500);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_2e8,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4c8);
  Environment::bind<float>
            ((Environment *)&local_2e8,
             (this->m_variables).out0.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
             m_ptr,(IVal *)local_550);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_2e8,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.m_ptr,
             &local_1a8);
  if (local_2a8.in0.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pVVar13) {
LAB_0088e74e:
    poVar4 = (ostringstream *)(local_468 + 8);
    local_468._0_8_ = local_508;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"All ",4);
    pTVar28 = local_4a8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_3f0);
    local_468._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_468 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"Pass","");
    pTVar28->m_code = QP_TEST_RESULT_PASS;
    (pTVar28->m_description)._M_dataplus._M_p = (pointer)&(pTVar28->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar28->m_description,local_468._0_8_,
               (char *)(local_468._0_8_ + CONCAT44(local_468._12_4_,local_468._8_4_)));
    uVar18 = local_458._M_allocated_capacity;
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_468 + 0x10)) goto LAB_0088e933;
  }
  else {
    local_4a0 = sVar24 + (sVar24 == 0);
    lVar19 = 0;
    local_4d8 = 0;
    pFVar27 = local_4d0;
    do {
      local_4c8 = (TestLog *)((ulong)local_4c8 & 0xffffffffffffff00);
      dStack_4c0 = INFINITY;
      p_Stack_4b8 = (_Base_ptr)0xfff0000000000000;
      lVar20 = 8;
      do {
        *(undefined1 *)((long)local_1a8.m_data + lVar20 + -8) = 0;
        *(undefined8 *)(&local_1a8.m_data[0].m_hasNaN + lVar20) = 0x7ff0000000000000;
        *(undefined8 *)((long)&local_1a8.m_data[0].m_lo + lVar20) = 0xfff0000000000000;
        lVar20 = lVar20 + 0x18;
      } while (lVar20 != 0x50);
      lVar20 = 8;
      do {
        *(undefined1 *)((long)local_1a8.m_data + lVar20 + -8) = 0;
        *(undefined8 *)(&local_1a8.m_data[0].m_hasNaN + lVar20) = 0x7ff0000000000000;
        *(undefined8 *)((long)&local_1a8.m_data[0].m_lo + lVar20) = 0xfff0000000000000;
        lVar20 = lVar20 + 0x18;
      } while (lVar20 != 0x50);
      local_570._8_4_ =
           local_2a8.in0.
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start[lVar19].m_data[2];
      local_570._0_8_ =
           *(undefined8 *)
            local_2a8.in0.
            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar19].m_data;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                ((IVal *)local_550,pFVar27,(Vector<float,_3> *)local_570);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_468,pFVar27,(IVal *)local_550);
      pIVar21 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_2e8,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      puVar22 = (undefined8 *)local_468;
      for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
        *(undefined8 *)pIVar21->m_data = *puVar22;
        puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
        pIVar21 = (IVal *)((long)pIVar21 + ((ulong)bVar29 * -2 + 1) * 8);
      }
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_2e8,
                 (this->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_2e8,
                 (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_2e8,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_440 = (this->m_caseCtx).precision;
      local_448 = pFVar27->m_maxValue;
      local_468._0_8_ = *(undefined8 *)pFVar27;
      local_468._8_4_ = pFVar27->m_fractionBits;
      local_468._12_4_ = pFVar27->m_hasSubnormal;
      local_458._M_allocated_capacity = *(undefined8 *)&pFVar27->m_hasInf;
      local_458._8_1_ = pFVar27->m_exactPrecision;
      local_458._9_7_ = *(undefined7 *)&pFVar27->field_0x19;
      local_430 = 0;
      pSVar7 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_438 = &local_2e8;
      (*pSVar7->_vptr_Statement[3])(pSVar7,(string *)local_468);
      pIVar21 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_2e8,
                           (this->m_variables).out1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_468,&local_228,pIVar21);
      psVar25 = (string *)local_468;
      pIVar21 = &local_1a8;
      for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
        *(pointer *)pIVar21->m_data = (psVar25->_M_dataplus)._M_p;
        psVar25 = (string *)((long)psVar25 + (ulong)bVar29 * -0x10 + 8);
        pIVar21 = (IVal *)((long)pIVar21 + ((ulong)bVar29 * -2 + 1) * 8);
      }
      bVar14 = ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doContains
                         (&local_1a8,
                          local_498.out1.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar19);
      local_468._0_8_ = local_468 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_468,"Shader output 1 is outside acceptable range","");
      bVar14 = tcu::ResultCollector::check(&local_1f8,bVar14,(string *)local_468);
      if ((TestLog *)local_468._0_8_ != (TestLog *)(local_468 + 0x10)) {
        operator_delete((void *)local_468._0_8_,(ulong)(local_458._M_allocated_capacity + 1));
      }
      x = Environment::lookup<float>
                    ((Environment *)&local_2e8,
                     (this->m_variables).out0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr);
      tcu::FloatFormat::convert((Interval *)local_468,&local_228,x);
      p_Stack_4b8 = (_Base_ptr)local_458._M_allocated_capacity;
      dStack_4c0 = (double)CONCAT44(local_468._12_4_,local_468._8_4_);
      local_4c8 = (TestLog *)local_468._0_8_;
      pTVar12 = local_4c8;
      fVar5 = local_498.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[lVar19];
      dVar30 = (double)fVar5;
      dVar31 = dVar30;
      if (NAN(fVar5)) {
        dVar31 = INFINITY;
        dVar30 = -INFINITY;
      }
      IVar26 = (IVal)(dVar30 <= (double)local_458._M_allocated_capacity && dStack_4c0 <= dVar31);
      if ((NAN(fVar5)) &&
         (dVar30 <= (double)local_458._M_allocated_capacity && dStack_4c0 <= dVar31)) {
        local_4c8._0_1_ = SUB81(local_468._0_8_,0);
        IVar26 = local_4c8._0_1_;
      }
      local_468._0_8_ = local_468 + 0x10;
      local_4c8 = pTVar12;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_468,"Shader output 0 is outside acceptable range","");
      bVar15 = tcu::ResultCollector::check(&local_1f8,(bool)((byte)IVar26 & 1),(string *)local_468);
      if ((TestLog *)local_468._0_8_ != (TestLog *)(local_468 + 0x10)) {
        operator_delete((void *)local_468._0_8_,(ulong)(local_458._M_allocated_capacity + 1));
      }
      pFVar27 = local_4d0;
      if (!bVar14 || !bVar15) {
        uVar17 = (int)local_4d8 + 1;
        local_4d8 = (ulong)uVar17;
        poVar4 = (ostringstream *)(local_468 + 8);
        if ((int)uVar17 < 0x65) {
          local_468._0_8_ = local_508;
          std::__cxx11::ostringstream::ostringstream(poVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
          pVVar9 = (this->m_variables).in0.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.
                   m_ptr;
          paVar23 = &aStack_540;
          pcVar10 = (pVVar9->m_name)._M_dataplus._M_p;
          local_550._0_8_ = paVar23;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_550,pcVar10,pcVar10 + (pVVar9->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar4,(char *)local_550._0_8_,(long)stack0xfffffffffffffab8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," = ",3);
          valueToString<tcu::Vector<float,3>>
                    ((string *)local_570,(shaderexecutor *)&local_228,
                     (FloatFormat *)
                     (local_2a8.in0.
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar19),
                     (Vector<float,_3> *)paVar23);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar4,(char *)local_570._0_8_,CONCAT44(uStack_564,local_570._8_4_))
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_570._0_8_ != &local_560) {
            operator_delete((void *)local_570._0_8_,local_560._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_550._0_8_ != &aStack_540) {
            operator_delete((void *)local_550._0_8_,(ulong)(aStack_540._M_allocated_capacity + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
          pVVar11 = (this->m_variables).out0.
                    super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr;
          local_550._0_8_ = &aStack_540;
          pcVar10 = (pVVar11->m_name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_550,pcVar10,pcVar10 + (pVVar11->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar4,(char *)local_550._0_8_,(long)stack0xfffffffffffffab8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," = ",3);
          valueToString<float>
                    ((string *)local_570,&local_228,
                     local_498.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar19);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar4,(char *)local_570._0_8_,CONCAT44(uStack_564,local_570._8_4_))
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar4,"\tExpected range: ",0x11);
          intervalToString<float>(&local_500,&local_228,(IVal *)&local_4c8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar4,local_500._M_dataplus._M_p,local_500._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_570._0_8_ != &local_560) {
            operator_delete((void *)local_570._0_8_,local_560._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_550._0_8_ != &aStack_540) {
            operator_delete((void *)local_550._0_8_,(ulong)(aStack_540._M_allocated_capacity + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
          pVVar9 = (this->m_variables).out1.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.
                   m_ptr;
          paVar23 = &aStack_540;
          pcVar10 = (pVVar9->m_name)._M_dataplus._M_p;
          local_550._0_8_ = paVar23;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_550,pcVar10,pcVar10 + (pVVar9->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar4,(char *)local_550._0_8_,(long)stack0xfffffffffffffab8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," = ",3);
          valueToString<tcu::Vector<float,3>>
                    ((string *)local_570,(shaderexecutor *)&local_228,
                     (FloatFormat *)
                     (local_498.out1.
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar19),
                     (Vector<float,_3> *)paVar23);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar4,(char *)local_570._0_8_,CONCAT44(uStack_564,local_570._8_4_))
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar4,"\tExpected range: ",0x11);
          intervalToString<tcu::Vector<float,3>>
                    (&local_500,(shaderexecutor *)&local_228,(FloatFormat *)&local_1a8,
                     (IVal *)paVar23);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar4,local_500._M_dataplus._M_p,local_500._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_570._0_8_ != &local_560) {
            operator_delete((void *)local_570._0_8_,local_560._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_550._0_8_ != &aStack_540) {
            operator_delete((void *)local_550._0_8_,(ulong)(aStack_540._M_allocated_capacity + 1));
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar4);
          std::ios_base::~ios_base(local_3f0);
        }
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != local_4a0);
    iVar16 = (int)local_4d8;
    if (iVar16 < 0x65) {
      if (iVar16 == 0) goto LAB_0088e74e;
    }
    else {
      poVar4 = (ostringstream *)(local_468 + 8);
      local_468._0_8_ = local_508;
      std::__cxx11::ostringstream::ostringstream(poVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"(Skipped ",9);
      std::ostream::operator<<(poVar4,iVar16 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar4);
      std::ios_base::~ios_base(local_3f0);
    }
    poVar4 = (ostringstream *)(local_468 + 8);
    local_468._0_8_ = local_508;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::ostream::operator<<(poVar4,iVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_3f0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
    std::ostream::operator<<(local_468,iVar16);
    pTVar28 = local_4a8;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_468);
    std::ios_base::~ios_base(local_3f8);
    local_468._0_8_ = local_468 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_468," test failed. Check log for the details","");
    p_Var2 = (_Base_ptr)(CONCAT44(local_468._12_4_,local_468._8_4_) + (long)stack0xfffffffffffffab8)
    ;
    uVar18 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_550._0_8_ != &aStack_540) {
      uVar18 = aStack_540._M_allocated_capacity;
    }
    if ((ulong)uVar18 < p_Var2) {
      uVar18 = (_Base_ptr)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_468 + 0x10)) {
        uVar18 = local_458._M_allocated_capacity;
      }
      if ((ulong)uVar18 < p_Var2) goto LAB_0088e73f;
      puVar22 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_468,0,(char *)0x0,local_550._0_8_);
    }
    else {
LAB_0088e73f:
      puVar22 = (undefined8 *)std::__cxx11::string::_M_append(local_550,local_468._0_8_);
    }
    local_1a8.m_data[0]._0_8_ = &local_1a8.m_data[0].m_hi;
    pdVar1 = (double *)(puVar22 + 2);
    if ((double *)*puVar22 == pdVar1) {
      local_1a8.m_data[0].m_hi = *pdVar1;
      local_1a8.m_data[1]._0_4_ = *(undefined4 *)(puVar22 + 3);
      local_1a8.m_data[1]._4_4_ = *(undefined4 *)((long)puVar22 + 0x1c);
    }
    else {
      local_1a8.m_data[0].m_hi = *pdVar1;
      local_1a8.m_data[0]._0_8_ = (double *)*puVar22;
    }
    local_1a8.m_data[0].m_lo = (double)puVar22[1];
    *puVar22 = pdVar1;
    puVar22[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar28->m_code = QP_TEST_RESULT_FAIL;
    (pTVar28->m_description)._M_dataplus._M_p = (pointer)&(pTVar28->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar28->m_description,local_1a8.m_data[0]._0_8_,
               (undefined1 *)((long)local_1a8.m_data[0].m_lo + local_1a8.m_data[0]._0_8_));
    if ((double *)local_1a8.m_data[0]._0_8_ != &local_1a8.m_data[0].m_hi) {
      operator_delete((void *)local_1a8.m_data[0]._0_8_,(long)local_1a8.m_data[0].m_hi + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_468 + 0x10)) {
      operator_delete((void *)local_468._0_8_,(ulong)(local_458._M_allocated_capacity + 1));
    }
    uVar18 = aStack_540._M_allocated_capacity;
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_550._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_550._0_8_ == &aStack_540) goto LAB_0088e933;
  }
  operator_delete(paVar23,(ulong)((long)&((_Base_ptr)uVar18)->_M_color + 1));
LAB_0088e933:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2e8);
  if (local_498.out1.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_498.out1.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_498.out1.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_498.out1.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_498.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_498.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_498.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_498.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2a8.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2a8.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2a8.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2a8.in0.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.in0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.in0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.in0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar28;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}